

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall
jpge::jpeg_encoder::optimize_huffman_table(jpeg_encoder *this,int table_num,int table_len)

{
  sym_freq *A;
  uint local_10fc;
  int local_10f8;
  int i_4;
  int i_3;
  int i_2;
  uint JPGE_CODE_SIZE_LIMIT;
  int i_1;
  int num_codes [33];
  sym_freq *pSyms;
  int i;
  uint32 *pSym_count;
  int num_used_syms;
  sym_freq syms1 [257];
  sym_freq local_828;
  sym_freq syms0 [257];
  int table_len_local;
  int table_num_local;
  jpeg_encoder *this_local;
  
  local_828.m_key = 1;
  local_828.m_sym_index = 0;
  pSym_count._4_4_ = 1;
  for (pSyms._4_4_ = 0; pSyms._4_4_ < table_len; pSyms._4_4_ = pSyms._4_4_ + 1) {
    if (this->m_huff_count[table_num][pSyms._4_4_] != 0) {
      (&local_828)[(int)pSym_count._4_4_].m_key = this->m_huff_count[table_num][pSyms._4_4_];
      syms0[(long)(int)pSym_count._4_4_ + -1].m_sym_index = pSyms._4_4_ + 1;
      pSym_count._4_4_ = pSym_count._4_4_ + 1;
    }
  }
  A = radix_sort_syms(pSym_count._4_4_,&local_828,(sym_freq *)&stack0xffffffffffffefc8);
  calculate_minimum_redundancy(A,pSym_count._4_4_);
  clear_obj<int[33]>((int (*) [33])&JPGE_CODE_SIZE_LIMIT);
  for (i_2 = 0; i_2 < (int)pSym_count._4_4_; i_2 = i_2 + 1) {
    (&JPGE_CODE_SIZE_LIMIT)[A[i_2].m_key] = (&JPGE_CODE_SIZE_LIMIT)[A[i_2].m_key] + 1;
  }
  huffman_enforce_max_code_size((int *)&JPGE_CODE_SIZE_LIMIT,pSym_count._4_4_,0x10);
  clear_obj<unsigned_char[17]>((uchar (*) [17])(this->m_huff_bits + table_num));
  for (i_4 = 1; i_4 < 0x11; i_4 = i_4 + 1) {
    this->m_huff_bits[table_num][i_4] = (uint8)(&JPGE_CODE_SIZE_LIMIT)[i_4];
  }
  local_10f8 = 0x10;
  do {
    local_10fc = pSym_count._4_4_;
    if (local_10f8 < 1) {
LAB_0018df86:
      while (local_10fc = local_10fc - 1, 0 < (int)local_10fc) {
        this->m_huff_val[table_num][(int)((pSym_count._4_4_ - 1) - local_10fc)] =
             (char)A[(int)local_10fc].m_sym_index + 0xff;
      }
      return;
    }
    if (this->m_huff_bits[table_num][local_10f8] != '\0') {
      this->m_huff_bits[table_num][local_10f8] = this->m_huff_bits[table_num][local_10f8] + 0xff;
      goto LAB_0018df86;
    }
    local_10f8 = local_10f8 + -1;
  } while( true );
}

Assistant:

void jpeg_encoder::optimize_huffman_table(int table_num, int table_len)
	{
		sym_freq syms0[MAX_HUFF_SYMBOLS], syms1[MAX_HUFF_SYMBOLS];
		syms0[0].m_key = 1; syms0[0].m_sym_index = 0;  // dummy symbol, assures that no valid code contains all 1's
		int num_used_syms = 1;
		const uint32* pSym_count = &m_huff_count[table_num][0];
		for (int i = 0; i < table_len; i++)
			if (pSym_count[i]) { syms0[num_used_syms].m_key = pSym_count[i]; syms0[num_used_syms++].m_sym_index = i + 1; }
		sym_freq* pSyms = radix_sort_syms(num_used_syms, syms0, syms1);
		calculate_minimum_redundancy(pSyms, num_used_syms);

		// Count the # of symbols of each code size.
		int num_codes[1 + MAX_HUFF_CODESIZE]; clear_obj(num_codes);
		for (int i = 0; i < num_used_syms; i++)
			num_codes[pSyms[i].m_key]++;

		const uint JPGE_CODE_SIZE_LIMIT = 16; // the maximum possible size of a JPEG Huffman code (valid range is [9,16] - 9 vs. 8 because of the dummy symbol)
		huffman_enforce_max_code_size(num_codes, num_used_syms, JPGE_CODE_SIZE_LIMIT);

		// Compute m_huff_bits array, which contains the # of symbols per code size.
		clear_obj(m_huff_bits[table_num]);
		for (int i = 1; i <= (int)JPGE_CODE_SIZE_LIMIT; i++)
			m_huff_bits[table_num][i] = static_cast<uint8>(num_codes[i]);

		// Remove the dummy symbol added above, which must be in largest bucket.
		for (int i = JPGE_CODE_SIZE_LIMIT; i >= 1; i--)
		{
			if (m_huff_bits[table_num][i]) { m_huff_bits[table_num][i]--; break; }
		}

		// Compute the m_huff_val array, which contains the symbol indices sorted by code size (smallest to largest).
		for (int i = num_used_syms - 1; i >= 1; i--)
			m_huff_val[table_num][num_used_syms - 1 - i] = static_cast<uint8>(pSyms[i].m_sym_index - 1);
	}